

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_div_generator.cpp
# Opt level: O2

void generate<short>(style gen_style)

{
  _Function_base *this;
  code *local_50 [2];
  code *local_40;
  code *local_38;
  code *local_30 [2];
  code *local_20;
  code *local_18;
  
  if (gen_style == const_func) {
    generate_const_func<short>();
    return;
  }
  if (gen_style == cpp_template) {
    local_50[1] = (code *)0x0;
    local_50[0] = generate_specialized_template<short>;
    local_38 = std::_Function_handler<void_(short),_void_(*)(short)>::_M_invoke;
    local_40 = std::_Function_handler<void_(short),_void_(*)(short)>::_M_manager;
    generator<short>((function<void_(short)> *)local_50);
    this = (_Function_base *)local_50;
  }
  else {
    if (gen_style != macro) {
      return;
    }
    local_30[1] = (code *)0x0;
    local_30[0] = generate_constant_macro<short>;
    local_18 = std::_Function_handler<void_(short),_void_(*)(short)>::_M_invoke;
    local_20 = std::_Function_handler<void_(short),_void_(*)(short)>::_M_manager;
    generator<short>((function<void_(short)> *)local_30);
    this = (_Function_base *)local_30;
  }
  std::_Function_base::~_Function_base(this);
  return;
}

Assistant:

void generate(style gen_style) {
    switch (gen_style)
    {
    case style::macro:
        generator<_IntT>(&generate_constant_macro<_IntT>);
        break;
    case style::cpp_template:
        generator<_IntT>(&generate_specialized_template<_IntT>);
        break;
    
    case style::const_func:
        generate_const_func<_IntT>();
        break;

    default:
        break;
    }
}